

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winfnt.c
# Opt level: O3

FT_Error FNT_Load_Glyph(FT_GlyphSlot slot,FT_Size size,FT_UInt glyph_index,FT_Int32 load_flags)

{
  short sVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  FT_Face pFVar5;
  long lVar6;
  FT_Memory memory;
  int iVar7;
  ulong uVar8;
  uchar *puVar9;
  long lVar10;
  ulong uVar11;
  uchar *puVar12;
  uint uVar13;
  uchar *puVar14;
  uint uVar15;
  FT_Error FVar16;
  long advance;
  uchar *puVar17;
  FT_Error error;
  FT_Error local_2c;
  
  pFVar5 = size->face;
  local_2c = 0;
  if (pFVar5 == (FT_Face)0x0) {
    FVar16 = 0x23;
  }
  else {
    lVar6 = pFVar5[1].num_faces;
    FVar16 = 6;
    if ((lVar6 != 0) && (glyph_index < (uint)pFVar5->num_glyphs)) {
      if (glyph_index == 0) {
        uVar13 = (uint)*(byte *)(lVar6 + 0x76);
      }
      else {
        uVar13 = glyph_index - 1;
      }
      sVar1 = *(short *)(lVar6 + 8);
      iVar7 = ((uint)(sVar1 == 0x300) * 2 + 4) * uVar13;
      uVar13 = iVar7 + 0x94;
      if (sVar1 != 0x300) {
        uVar13 = iVar7 + 0x76;
      }
      uVar8 = (ulong)uVar13;
      uVar11 = *(ulong *)(lVar6 + 0x10);
      if (uVar8 < (((ulong)((uint)(sVar1 != 0x300) * 2) | 0xfffffffffffffffc) + uVar11) - 2) {
        lVar10 = *(long *)(lVar6 + 0xd8);
        uVar2 = *(ushort *)(lVar10 + uVar8);
        (slot->bitmap).width = (uint)uVar2;
        if (sVar1 == 0x300) {
          uVar8 = (ulong)*(uint *)(lVar10 + 2 + uVar8);
        }
        else {
          uVar8 = (ulong)*(ushort *)(lVar10 + 2 + uVar8);
        }
        if (uVar8 < uVar11) {
          uVar3 = *(ushort *)(lVar6 + 0x6c);
          (slot->bitmap).rows = (uint)uVar3;
          (slot->bitmap).pixel_mode = '\x01';
          slot->bitmap_left = 0;
          uVar4 = *(ushort *)(lVar6 + 0x5c);
          slot->bitmap_top = (uint)uVar4;
          slot->format = FT_GLYPH_FORMAT_BITMAP;
          lVar10 = (ulong)uVar2 << 6;
          (slot->metrics).width = lVar10;
          advance = (ulong)uVar3 << 6;
          (slot->metrics).height = advance;
          (slot->metrics).horiAdvance = lVar10;
          (slot->metrics).horiBearingX = 0;
          (slot->metrics).horiBearingY = (ulong)uVar4 << 6;
          ft_synthesize_vertical_metrics(&slot->metrics,advance);
          if (((uint)load_flags >> 0x16 & 1) != 0) {
            return 0;
          }
          puVar17 = (uchar *)(*(long *)(lVar6 + 0xd8) + uVar8);
          memory = slot->face->memory;
          uVar13 = (slot->bitmap).width + 7;
          uVar15 = uVar13 >> 3;
          (slot->bitmap).pitch = uVar15;
          if (7 < uVar13) {
            uVar13 = (slot->bitmap).rows;
            if (*(ulong *)(lVar6 + 0x10) < uVar8 + uVar13 * uVar15) {
              return 3;
            }
            puVar9 = (uchar *)ft_mem_realloc(memory,(ulong)uVar15,0,(ulong)uVar13,(void *)0x0,
                                             &local_2c);
            (slot->bitmap).buffer = puVar9;
            if (local_2c != 0) {
              return local_2c;
            }
            do {
              uVar11 = (ulong)(slot->bitmap).rows;
              if (uVar11 != 0) {
                puVar12 = puVar17 + uVar11;
                puVar14 = puVar9;
                do {
                  *puVar14 = *puVar17;
                  puVar17 = puVar17 + 1;
                  puVar14 = puVar14 + (slot->bitmap).pitch;
                } while (puVar17 < puVar12);
              }
              puVar9 = puVar9 + 1;
              uVar15 = uVar15 - 1;
            } while (uVar15 != 0);
            slot->internal->flags = 1;
            return 0;
          }
        }
      }
      FVar16 = 3;
    }
  }
  return FVar16;
}

Assistant:

static FT_Error
  FNT_Load_Glyph( FT_GlyphSlot  slot,
                  FT_Size       size,
                  FT_UInt       glyph_index,
                  FT_Int32      load_flags )
  {
    FNT_Face    face   = (FNT_Face)FT_SIZE_FACE( size );
    FNT_Font    font;
    FT_Error    error  = FT_Err_Ok;
    FT_Byte*    p;
    FT_UInt     len;
    FT_Bitmap*  bitmap = &slot->bitmap;
    FT_ULong    offset;
    FT_Bool     new_format;


    if ( !face )
    {
      error = FT_THROW( Invalid_Face_Handle );
      goto Exit;
    }

    font = face->font;

    if ( !font                                                   ||
         glyph_index >= (FT_UInt)( FT_FACE( face )->num_glyphs ) )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    FT_TRACE1(( "FNT_Load_Glyph: glyph index %d\n", glyph_index ));

    if ( glyph_index > 0 )
      glyph_index--;                           /* revert to real index */
    else
      glyph_index = font->header.default_char; /* the `.notdef' glyph  */

    new_format = FT_BOOL( font->header.version == 0x300 );
    len        = new_format ? 6 : 4;

    /* get glyph width and offset */
    offset = ( new_format ? 148 : 118 ) + len * glyph_index;

    if ( offset >= font->header.file_size - 2 - ( new_format ? 4 : 2 ) )
    {
      FT_TRACE2(( "invalid FNT offset\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    p = font->fnt_frame + offset;

    bitmap->width = FT_NEXT_USHORT_LE( p );

    /* jump to glyph entry */
    if ( new_format )
      offset = FT_NEXT_ULONG_LE( p );
    else
      offset = FT_NEXT_USHORT_LE( p );

    if ( offset >= font->header.file_size )
    {
      FT_TRACE2(( "invalid FNT offset\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    bitmap->rows       = font->header.pixel_height;
    bitmap->pixel_mode = FT_PIXEL_MODE_MONO;

    slot->bitmap_left     = 0;
    slot->bitmap_top      = font->header.ascent;
    slot->format          = FT_GLYPH_FORMAT_BITMAP;

    /* now set up metrics */
    slot->metrics.width        = (FT_Pos)( bitmap->width << 6 );
    slot->metrics.height       = (FT_Pos)( bitmap->rows << 6 );
    slot->metrics.horiAdvance  = (FT_Pos)( bitmap->width << 6 );
    slot->metrics.horiBearingX = 0;
    slot->metrics.horiBearingY = slot->bitmap_top << 6;

    ft_synthesize_vertical_metrics( &slot->metrics,
                                    (FT_Pos)( bitmap->rows << 6 ) );

    if ( load_flags & FT_LOAD_BITMAP_METRICS_ONLY )
      goto Exit;

    /* jump to glyph data */
    p = font->fnt_frame + /* font->header.bits_offset */ + offset;

    /* allocate and build bitmap */
    {
      FT_Memory  memory = FT_FACE_MEMORY( slot->face );
      FT_UInt    pitch  = ( bitmap->width + 7 ) >> 3;
      FT_Byte*   column;
      FT_Byte*   write;


      bitmap->pitch = (int)pitch;
      if ( !pitch                                                 ||
           offset + pitch * bitmap->rows > font->header.file_size )
      {
        FT_TRACE2(( "invalid bitmap width\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Exit;
      }

      /* note: since glyphs are stored in columns and not in rows we */
      /*       can't use ft_glyphslot_set_bitmap                     */
      if ( FT_ALLOC_MULT( bitmap->buffer, bitmap->rows, pitch ) )
        goto Exit;

      column = (FT_Byte*)bitmap->buffer;

      for ( ; pitch > 0; pitch--, column++ )
      {
        FT_Byte*  limit = p + bitmap->rows;


        for ( write = column; p < limit; p++, write += bitmap->pitch )
          *write = *p;
      }

      slot->internal->flags = FT_GLYPH_OWN_BITMAP;
    }

  Exit:
    return error;
  }